

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# iso8859_10.h
# Opt level: O0

int iso8859_10_wctomb(void *conv,uchar *r,uint wc,int n)

{
  uchar local_29;
  uchar c;
  int n_local;
  uint wc_local;
  uchar *r_local;
  void *conv_local;
  
  local_29 = '\0';
  if (wc < 0xa0) {
    *r = (uchar)wc;
    conv_local._4_4_ = 1;
  }
  else {
    if ((wc < 0xa0) || (0x17f < wc)) {
      if (wc == 0x2015) {
        local_29 = 0xbd;
      }
    }
    else {
      local_29 = iso8859_10_page00[wc - 0xa0];
    }
    if (local_29 == '\0') {
      conv_local._4_4_ = -1;
    }
    else {
      *r = local_29;
      conv_local._4_4_ = 1;
    }
  }
  return conv_local._4_4_;
}

Assistant:

static int
iso8859_10_wctomb (conv_t conv, unsigned char *r, ucs4_t wc, int n)
{
  unsigned char c = 0;
  if (wc < 0x00a0) {
    *r = wc;
    return 1;
  }
  else if (wc >= 0x00a0 && wc < 0x0180)
    c = iso8859_10_page00[wc-0x00a0];
  else if (wc == 0x2015)
    c = 0xbd;
  if (c != 0) {
    *r = c;
    return 1;
  }
  return RET_ILSEQ;
}